

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O3

void __thiscall sznet::net::TcpClient::disconnect(TcpClient *this)

{
  MutexLock *mutex;
  TcpConnection *this_00;
  MutexLockGuard lock;
  
  mutex = &this->m_mutex;
  this->m_connect = false;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  this_00 = (this->m_connection).
            super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (TcpConnection *)0x0) {
    TcpConnection::forceClose(this_00);
  }
  (this->m_mutex).m_holder = 0;
  sz_mutex_unlock(&mutex->m_mutex);
  return;
}

Assistant:

void TcpClient::disconnect()
{
	m_connect = false;

	{
		MutexLockGuard lock(m_mutex);
		if (m_connection)
		{
			// m_connection->shutdown();
			m_connection->forceClose();
		}
	}
}